

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O3

string * __thiscall
LinearRegression::generateGradients_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer pPVar5;
  string *__return_storage_ptr___00;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  View *pVVar9;
  pointer pAVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer ppVar13;
  ulong *puVar14;
  size_type *psVar15;
  size_t sVar16;
  ulong uVar17;
  pointer pPVar18;
  size_t sVar19;
  char cVar20;
  _Alloc_hider _Var21;
  undefined8 uVar22;
  pointer ppVar23;
  ulong uVar24;
  size_t sVar25;
  string __str_1;
  string labelStr;
  string __str;
  string errorString;
  string gradString;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  actualGradients;
  ulong *local_448;
  long local_440;
  ulong local_438;
  long lStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  long local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  ulong *local_408;
  long local_400;
  ulong local_3f8;
  long lStack_3f0;
  LinearRegression *local_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  long lStack_3c8;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  ulong *local_320;
  long local_318;
  ulong local_310;
  long lStack_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  undefined8 local_2a0;
  pointer local_298;
  size_t local_290;
  long local_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0 [2];
  ulong *local_1a0;
  long local_198;
  ulong local_190 [2];
  ulong *local_180;
  long local_178;
  ulong local_170 [2];
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  local_e0;
  string *local_c8;
  ulong local_c0;
  pointer local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_3e8 = this;
  local_c8 = __return_storage_ptr__;
  local_290 = QueryCompiler::numberOfViews
                        ((this->_compiler).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::vector(&local_e0,local_290,(allocator_type *)local_2c0);
  pPVar5 = partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>._M_impl
      .super__Vector_impl_data._M_start !=
      partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pPVar18 = partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      plVar7 = *(long **)&((*(pPVar18->query->_aggregates).
                             super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                             super__Vector_impl_data._M_start)->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
      local_2c0._8_8_ = (pointer)0x0;
      aStack_2b0._M_allocated_capacity = 0;
      aStack_2b0._8_8_ = (pointer)0x0;
      local_2c0._0_8_ = plVar7[1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)(local_2c0 + 8),&pPVar18->inputVariables);
      std::vector<ActualGradient,_std::allocator<ActualGradient>_>::push_back
                (local_e0.
                 super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *plVar7,(value_type *)local_2c0);
      if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c0._8_8_);
      }
      pPVar18 = pPVar18 + 1;
    } while (pPVar18 != pPVar5);
  }
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_3c0.field_2._M_allocated_capacity = *puVar14;
    local_3c0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_3c0.field_2._M_allocated_capacity = *puVar14;
    local_3c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_3c0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\x03');
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    uVar22 = local_3c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      uVar22 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) goto LAB_00138f48;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_380,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
  }
  else {
LAB_00138f48:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_380._M_dataplus._M_p);
  }
  local_3e0 = &local_3d0;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_3d0 = *puVar14;
    lStack_3c8 = puVar8[3];
  }
  else {
    local_3d0 = *puVar14;
    local_3e0 = (ulong *)*puVar8;
  }
  local_3d8 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_428 = &local_418;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_418._8_8_ = plVar7[3];
  }
  else {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7;
  }
  local_420 = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x06');
  uVar22 = 0xf;
  if (local_428 != &local_418) {
    uVar22 = local_418._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_360._M_string_length + local_420) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      uVar22 = local_360.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_360._M_string_length + local_420) goto LAB_00139087;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_428);
  }
  else {
LAB_00139087:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_360._M_dataplus._M_p);
  }
  local_448 = &local_438;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_438 = *puVar14;
    lStack_430 = puVar8[3];
  }
  else {
    local_438 = *puVar14;
    local_448 = (ulong *)*puVar8;
  }
  local_440 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_3f8 = *puVar14;
    lStack_3f0 = puVar8[3];
    local_408 = &local_3f8;
  }
  else {
    local_3f8 = *puVar14;
    local_408 = (ulong *)*puVar8;
  }
  local_400 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_340 = &local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,'\x01');
  *(undefined1 *)local_340 = 0x38;
  uVar24 = 0xf;
  if (local_408 != &local_3f8) {
    uVar24 = local_3f8;
  }
  if (uVar24 < (ulong)(local_338 + local_400)) {
    uVar24 = 0xf;
    if (local_340 != &local_330) {
      uVar24 = local_330;
    }
    if (uVar24 < (ulong)(local_338 + local_400)) goto LAB_001391b6;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_408);
  }
  else {
LAB_001391b6:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_340);
  }
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar15 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_300.field_2._M_allocated_capacity = *psVar15;
    local_300.field_2._8_8_ = puVar8[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar15;
    local_300._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_300._M_string_length = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_2c0._0_8_ = &aStack_2b0;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    aStack_2b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    aStack_2b0._8_8_ = plVar7[3];
  }
  else {
    aStack_2b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_2c0._8_8_ = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x03');
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
  local_3e0 = &local_3d0;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_3d0 = *puVar14;
    lStack_3c8 = puVar8[3];
  }
  else {
    local_3d0 = *puVar14;
    local_3e0 = (ulong *)*puVar8;
  }
  local_3d8 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  uVar24 = 0xf;
  if (local_3e0 != &local_3d0) {
    uVar24 = local_3d0;
  }
  if (uVar24 < local_3a0._M_string_length + local_3d8) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      uVar22 = local_3a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_3a0._M_string_length + local_3d8) goto LAB_0013946d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_3e0);
  }
  else {
LAB_0013946d:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_3a0._M_dataplus._M_p);
  }
  local_428 = &local_418;
  psVar15 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_418._M_allocated_capacity = *psVar15;
    local_418._8_8_ = puVar8[3];
  }
  else {
    local_418._M_allocated_capacity = *psVar15;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
  }
  local_420 = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)psVar15 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
  local_448 = &local_438;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_438 = *puVar14;
    lStack_430 = puVar8[3];
  }
  else {
    local_438 = *puVar14;
    local_448 = (ulong *)*puVar8;
  }
  local_440 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\x06');
  uVar24 = 0xf;
  if (local_448 != &local_438) {
    uVar24 = local_438;
  }
  if (uVar24 < local_380._M_string_length + local_440) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      uVar22 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_380._M_string_length + local_440) goto LAB_001395a1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_448);
  }
  else {
LAB_001395a1:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_448,(ulong)local_380._M_dataplus._M_p);
  }
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_3f8 = *puVar14;
    lStack_3f0 = puVar8[3];
    local_408 = &local_3f8;
  }
  else {
    local_3f8 = *puVar14;
    local_408 = (ulong *)*puVar8;
  }
  local_400 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_408);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_300.field_2._M_allocated_capacity = *psVar15;
    local_300.field_2._8_8_ = plVar7[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar15;
    local_300._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_300._M_string_length = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if (local_290 != 0) {
    uVar24 = 0;
    do {
      pVVar9 = QueryCompiler::getView
                         ((local_3e8->_compiler).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar24);
      bVar3 = (pVVar9->_fVars).super__Base_bitset<2UL>._M_w[1] != 0;
      bVar4 = (pVVar9->_fVars).super__Base_bitset<2UL>._M_w[0] != 0;
      local_288 = uVar24 * 3;
      local_2a0 = 9;
      if (local_e0.
          super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar24].
          super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_e0.
          super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar24].
          super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (bVar3 || bVar4) {
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_360,'\x06');
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_360);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          puVar14 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_380.field_2._M_allocated_capacity = *puVar14;
            local_380.field_2._8_8_ = plVar7[3];
          }
          else {
            local_380.field_2._M_allocated_capacity = *puVar14;
            local_380._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_380._M_string_length = plVar7[1];
          *plVar7 = (long)puVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_00139b63;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_00139b63;
              }
              if (uVar11 < 10000) goto LAB_00139b63;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_00139b63:
          local_340 = &local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_340,(uint)local_338,uVar24)
          ;
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            uVar22 = local_380.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_338 + local_380._M_string_length) {
            uVar11 = 0xf;
            if (local_340 != &local_330) {
              uVar11 = local_330;
            }
            if (uVar11 < local_338 + local_380._M_string_length) goto LAB_00139bed;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_340,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
          }
          else {
LAB_00139bed:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_340);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          psVar15 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_3a0.field_2._M_allocated_capacity = *psVar15;
            local_3a0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_3a0.field_2._M_allocated_capacity = *psVar15;
            local_3a0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_3a0._M_string_length = puVar8[1];
          *puVar8 = psVar15;
          puVar8[1] = 0;
          *(undefined1 *)psVar15 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          puVar14 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3c0._M_string_length = plVar7[1];
          *plVar7 = (long)puVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0013a044;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0013a044;
              }
              if (uVar11 < 10000) goto LAB_0013a044;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_0013a044:
          local_320 = &local_310;
          std::__cxx11::string::_M_construct((ulong)&local_320,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320,(uint)local_318,uVar24)
          ;
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            uVar22 = local_3c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_318 + local_3c0._M_string_length) {
            uVar11 = 0xf;
            if (local_320 != &local_310) {
              uVar11 = local_310;
            }
            if (uVar11 < local_318 + local_3c0._M_string_length) goto LAB_0013a0ce;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_320,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
          }
          else {
LAB_0013a0ce:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_320);
          }
          local_3e0 = &local_3d0;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3d0 = *puVar14;
            lStack_3c8 = puVar8[3];
          }
          else {
            local_3d0 = *puVar14;
            local_3e0 = (ulong *)*puVar8;
          }
          local_3d8 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e0);
          local_428 = &local_418;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar12) {
            local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_418._8_8_ = plVar7[3];
          }
          else {
            local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar7;
          }
          local_420 = plVar7[1];
          *plVar7 = (long)paVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_2e0 = &local_2d0;
          std::__cxx11::string::_M_construct((ulong)&local_2e0,'\x06');
          uVar22 = 0xf;
          if (local_428 != &local_418) {
            uVar22 = local_418._M_allocated_capacity;
          }
          if ((ulong)uVar22 < (ulong)(local_2d8 + local_420)) {
            uVar11 = 0xf;
            if (local_2e0 != &local_2d0) {
              uVar11 = local_2d0;
            }
            if (uVar11 < (ulong)(local_2d8 + local_420)) goto LAB_0013a203;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_428)
            ;
          }
          else {
LAB_0013a203:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_2e0);
          }
          local_448 = &local_438;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_438 = *puVar14;
            lStack_430 = puVar8[3];
          }
          else {
            local_438 = *puVar14;
            local_448 = (ulong *)*puVar8;
          }
          local_440 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
          if (local_2e0 != &local_2d0) {
            operator_delete(local_2e0);
          }
          if (local_428 != &local_418) {
            operator_delete(local_428);
          }
          if (local_3e0 != &local_3d0) {
            operator_delete(local_3e0);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_360,'\x06');
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_360);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          puVar14 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_380.field_2._M_allocated_capacity = *puVar14;
            local_380.field_2._8_8_ = plVar7[3];
          }
          else {
            local_380.field_2._M_allocated_capacity = *puVar14;
            local_380._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_380._M_string_length = plVar7[1];
          *plVar7 = (long)puVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0013a686;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0013a686;
              }
              if (uVar11 < 10000) goto LAB_0013a686;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_0013a686:
          local_340 = &local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_340,(uint)local_338,uVar24)
          ;
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            uVar22 = local_380.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_338 + local_380._M_string_length) {
            uVar11 = 0xf;
            if (local_340 != &local_330) {
              uVar11 = local_330;
            }
            if (uVar11 < local_338 + local_380._M_string_length) goto LAB_0013a710;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_340,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
          }
          else {
LAB_0013a710:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_340);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          puVar14 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_3a0.field_2._M_allocated_capacity = *puVar14;
            local_3a0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_3a0.field_2._M_allocated_capacity = *puVar14;
            local_3a0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_3a0._M_string_length = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          puVar14 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_3c0._M_string_length = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0013aa86;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0013aa86;
              }
              if (uVar11 < 10000) goto LAB_0013aa86;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_0013aa86:
          local_320 = &local_310;
          std::__cxx11::string::_M_construct((ulong)&local_320,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320,(uint)local_318,uVar24)
          ;
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            uVar22 = local_3c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_318 + local_3c0._M_string_length) {
            uVar11 = 0xf;
            if (local_320 != &local_310) {
              uVar11 = local_310;
            }
            if (uVar11 < local_318 + local_3c0._M_string_length) goto LAB_0013ab10;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_320,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
          }
          else {
LAB_0013ab10:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_320);
          }
          local_3e0 = &local_3d0;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3d0 = *puVar14;
            lStack_3c8 = puVar8[3];
          }
          else {
            local_3d0 = *puVar14;
            local_3e0 = (ulong *)*puVar8;
          }
          local_3d8 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
          local_428 = &local_418;
          psVar15 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_418._M_allocated_capacity = *psVar15;
            local_418._8_8_ = puVar8[3];
          }
          else {
            local_418._M_allocated_capacity = *psVar15;
            local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
          }
          local_420 = puVar8[1];
          *puVar8 = psVar15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          local_2e0 = &local_2d0;
          std::__cxx11::string::_M_construct((ulong)&local_2e0,'\x06');
          uVar22 = 0xf;
          if (local_428 != &local_418) {
            uVar22 = local_418._M_allocated_capacity;
          }
          if ((ulong)uVar22 < (ulong)(local_2d8 + local_420)) {
            uVar11 = 0xf;
            if (local_2e0 != &local_2d0) {
              uVar11 = local_2d0;
            }
            if (uVar11 < (ulong)(local_2d8 + local_420)) goto LAB_0013ac45;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_428)
            ;
          }
          else {
LAB_0013ac45:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_2e0);
          }
          local_448 = &local_438;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_438 = *puVar14;
            lStack_430 = puVar8[3];
          }
          else {
            local_438 = *puVar14;
            local_448 = (ulong *)*puVar8;
          }
          local_440 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
          if (local_2e0 != &local_2d0) {
            operator_delete(local_2e0);
          }
          if (local_428 != &local_418) {
            operator_delete(local_428);
          }
          if (local_3e0 != &local_3d0) {
            operator_delete(local_3e0);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
        }
        else {
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x06');
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          puVar14 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3c0._M_string_length = plVar7[1];
          *plVar7 = (long)puVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_00139995;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_00139995;
              }
              if (uVar11 < 10000) goto LAB_00139995;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_00139995:
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_380,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_380._M_dataplus._M_p,(uint)local_380._M_string_length,uVar24);
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            uVar22 = local_3c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              uVar22 = local_380.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length)
            goto LAB_00139a2f;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_380,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
          }
          else {
LAB_00139a2f:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_3c0,(ulong)local_380._M_dataplus._M_p);
          }
          local_3e0 = &local_3d0;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3d0 = *puVar14;
            lStack_3c8 = puVar8[3];
          }
          else {
            local_3d0 = *puVar14;
            local_3e0 = (ulong *)*puVar8;
          }
          local_3d8 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e0);
          local_428 = &local_418;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar12) {
            local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_418._8_8_ = plVar7[3];
          }
          else {
            local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar7;
          }
          local_420 = plVar7[1];
          *plVar7 = (long)paVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_00139d39;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_00139d39;
              }
              if (uVar11 < 10000) goto LAB_00139d39;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_00139d39:
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_360,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_360._M_dataplus._M_p,(uint)local_360._M_string_length,uVar24);
          uVar22 = 0xf;
          if (local_428 != &local_418) {
            uVar22 = local_418._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_360._M_string_length + local_420) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              uVar22 = local_360.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_360._M_string_length + local_420) goto LAB_00139dc7;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_428)
            ;
          }
          else {
LAB_00139dc7:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_428,(ulong)local_360._M_dataplus._M_p);
          }
          local_448 = &local_438;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_438 = *puVar14;
            lStack_430 = puVar8[3];
          }
          else {
            local_438 = *puVar14;
            local_448 = (ulong *)*puVar8;
          }
          local_440 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          if (local_428 != &local_418) {
            operator_delete(local_428);
          }
          if (local_3e0 != &local_3d0) {
            operator_delete(local_3e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x06');
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          puVar14 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_3c0.field_2._M_allocated_capacity = *puVar14;
            local_3c0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_3c0._M_string_length = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0013a4b8;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0013a4b8;
              }
              if (uVar11 < 10000) goto LAB_0013a4b8;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_0013a4b8:
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_380,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_380._M_dataplus._M_p,(uint)local_380._M_string_length,uVar24);
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            uVar22 = local_3c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              uVar22 = local_380.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length)
            goto LAB_0013a552;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_380,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
          }
          else {
LAB_0013a552:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_3c0,(ulong)local_380._M_dataplus._M_p);
          }
          local_3e0 = &local_3d0;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3d0 = *puVar14;
            lStack_3c8 = puVar8[3];
          }
          else {
            local_3d0 = *puVar14;
            local_3e0 = (ulong *)*puVar8;
          }
          local_3d8 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
          local_428 = &local_418;
          psVar15 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_418._M_allocated_capacity = *psVar15;
            local_418._8_8_ = puVar8[3];
          }
          else {
            local_418._M_allocated_capacity = *psVar15;
            local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
          }
          local_420 = puVar8[1];
          *puVar8 = psVar15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          cVar20 = '\x01';
          if (9 < uVar24) {
            uVar11 = uVar24;
            cVar6 = '\x04';
            do {
              cVar20 = cVar6;
              if (uVar11 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0013a85c;
              }
              if (uVar11 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0013a85c;
              }
              if (uVar11 < 10000) goto LAB_0013a85c;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar6 = cVar20 + '\x04';
            } while (bVar2);
            cVar20 = cVar20 + '\x01';
          }
LAB_0013a85c:
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_360,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_360._M_dataplus._M_p,(uint)local_360._M_string_length,uVar24);
          uVar22 = 0xf;
          if (local_428 != &local_418) {
            uVar22 = local_418._M_allocated_capacity;
          }
          if ((ulong)uVar22 < local_360._M_string_length + local_420) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              uVar22 = local_360.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_360._M_string_length + local_420) goto LAB_0013a8ea;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_428)
            ;
          }
          else {
LAB_0013a8ea:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_428,(ulong)local_360._M_dataplus._M_p);
          }
          local_448 = &local_438;
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_438 = *puVar14;
            lStack_430 = puVar8[3];
          }
          else {
            local_438 = *puVar14;
            local_448 = (ulong *)*puVar8;
          }
          local_440 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          if (local_428 != &local_418) {
            operator_delete(local_428);
          }
          if (local_3e0 != &local_3d0) {
            operator_delete(local_3e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          local_2a0 = 6;
        }
      }
      pAVar10 = (&((local_e0.
                    super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                  super__Vector_impl_data._M_start)[local_288];
      local_b8 = (&((local_e0.
                     super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                   super__Vector_impl_data._M_finish)[local_288];
      if (pAVar10 != local_b8) {
        do {
          local_c0 = uVar24;
          ppVar23 = (pAVar10->incVars).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar13 = *(pointer *)
                     ((long)&(pAVar10->incVars).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl + 8);
          local_298 = pAVar10;
          if (ppVar13 != ppVar23) {
            sVar19 = 1000;
            uVar24 = 0;
            sVar25 = 1000;
            do {
              if (ppVar23[uVar24].first != local_3e8->labelID) {
                ppVar13 = ppVar23 + uVar24;
                uVar11 = sVar19;
                sVar16 = sVar25;
                if (ppVar23[uVar24].first != sVar19 || ppVar13->second != sVar25) {
                  local_448 = &local_438;
                  std::__cxx11::string::_M_construct((ulong)&local_448,(char)local_2a0);
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  uVar11 = ppVar13->first;
                  sVar16 = ppVar13->second;
                }
                if ((uVar11 == sVar16) && (uVar11 = sVar19, sVar16 != sVar19 || sVar25 != sVar16)) {
                  std::__cxx11::string::append((char *)&local_300);
                  uVar11 = ppVar13->first;
                }
                if (((local_3e8->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar11 >> 6] >>
                     (uVar11 & 0x3f) & 1) == 0) {
                  local_3e0 = &local_3d0;
                  std::__cxx11::string::_M_construct((ulong)&local_3e0,(char)local_2a0);
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
                  local_428 = &local_418;
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8 == paVar12) {
                    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_418._8_8_ = puVar8[3];
                  }
                  else {
                    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar8;
                  }
                  local_420 = puVar8[1];
                  *puVar8 = paVar12;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  uVar11 = (local_3e8->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[ppVar13->first];
                  cVar20 = '\x01';
                  if (9 < uVar11) {
                    uVar17 = uVar11;
                    cVar6 = '\x04';
                    do {
                      cVar20 = cVar6;
                      if (uVar17 < 100) {
                        cVar20 = cVar20 + -2;
                        goto LAB_0013b738;
                      }
                      if (uVar17 < 1000) {
                        cVar20 = cVar20 + -1;
                        goto LAB_0013b738;
                      }
                      if (uVar17 < 10000) goto LAB_0013b738;
                      bVar2 = 99999 < uVar17;
                      uVar17 = uVar17 / 10000;
                      cVar6 = cVar20 + '\x04';
                    } while (bVar2);
                    cVar20 = cVar20 + '\x01';
                  }
LAB_0013b738:
                  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_3c0,cVar20);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_3c0._M_dataplus._M_p,(uint)local_3c0._M_string_length,uVar11);
                  uVar22 = 0xf;
                  if (local_428 != &local_418) {
                    uVar22 = local_418._M_allocated_capacity;
                  }
                  if ((ulong)uVar22 < local_3c0._M_string_length + local_420) {
                    uVar22 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                      uVar22 = local_3c0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_3c0._M_string_length + local_420) goto LAB_0013b7c6;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_428);
                  }
                  else {
LAB_0013b7c6:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_428,(ulong)local_3c0._M_dataplus._M_p);
                  }
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                    operator_delete(local_3c0._M_dataplus._M_p);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if (local_3e0 != &local_3d0) {
                    operator_delete(local_3e0);
                  }
                  if (sVar19 != ppVar13->first || ppVar13->second != sVar25) {
                    uVar11 = (local_3e8->_parameterIndex).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[ppVar13->first];
                    cVar20 = '\x01';
                    if (9 < uVar11) {
                      uVar17 = uVar11;
                      cVar6 = '\x04';
                      do {
                        cVar20 = cVar6;
                        if (uVar17 < 100) {
                          cVar20 = cVar20 + -2;
                          goto LAB_0013b983;
                        }
                        if (uVar17 < 1000) {
                          cVar20 = cVar20 + -1;
                          goto LAB_0013b983;
                        }
                        if (uVar17 < 10000) goto LAB_0013b983;
                        bVar2 = 99999 < uVar17;
                        uVar17 = uVar17 / 10000;
                        cVar6 = cVar20 + '\x04';
                      } while (bVar2);
                      cVar20 = cVar20 + '\x01';
                    }
LAB_0013b983:
                    local_428 = &local_418;
                    std::__cxx11::string::_M_construct((ulong)&local_428,cVar20);
                    std::__detail::__to_chars_10_impl<unsigned_long>
                              (local_428->_M_local_buf,(uint)local_420,uVar11);
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x2a26af)
                    ;
                    local_448 = &local_438;
                    puVar14 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar14) {
                      local_438 = *puVar14;
                      lStack_430 = puVar8[3];
                    }
                    else {
                      local_438 = *puVar14;
                      local_448 = (ulong *)*puVar8;
                    }
                    local_440 = puVar8[1];
                    *puVar8 = puVar14;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                    local_408 = &local_3f8;
                    puVar14 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar14) {
                      local_3f8 = *puVar14;
                      lStack_3f0 = puVar8[3];
                    }
                    else {
                      local_3f8 = *puVar14;
                      local_408 = (ulong *)*puVar8;
                    }
                    local_400 = puVar8[1];
                    *puVar8 = puVar14;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                    if (local_408 != &local_3f8) {
                      operator_delete(local_408);
                    }
                    if (local_448 != &local_438) {
                      operator_delete(local_448);
                    }
                    _Var21._M_p = (pointer)local_428;
                    if (local_428 != &local_418) goto LAB_0013bab3;
                  }
                }
                else {
                  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_3a0,(char)local_2a0);
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
                  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
                  puVar14 = puVar8 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_3c0.field_2._M_allocated_capacity = *puVar14;
                    local_3c0.field_2._8_8_ = puVar8[3];
                  }
                  else {
                    local_3c0.field_2._M_allocated_capacity = *puVar14;
                    local_3c0._M_dataplus._M_p = (pointer)*puVar8;
                  }
                  local_3c0._M_string_length = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_380,local_3e8,ppVar13->first);
                  uVar22 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                    uVar22 = local_3c0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) {
                    uVar22 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_380._M_dataplus._M_p != &local_380.field_2) {
                      uVar22 = local_380.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length)
                    goto LAB_0013b117;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_380,0,(char *)0x0,
                                        (ulong)local_3c0._M_dataplus._M_p);
                  }
                  else {
LAB_0013b117:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_3c0,(ulong)local_380._M_dataplus._M_p);
                  }
                  local_3e0 = &local_3d0;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3d0 = *puVar14;
                    lStack_3c8 = puVar8[3];
                  }
                  else {
                    local_3d0 = *puVar14;
                    local_3e0 = (ulong *)*puVar8;
                  }
                  local_3d8 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
                  local_428 = &local_418;
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8 == paVar12) {
                    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_418._8_8_ = puVar8[3];
                  }
                  else {
                    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar8;
                  }
                  local_420 = puVar8[1];
                  *puVar8 = paVar12;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_360,local_3e8,ppVar13->first);
                  uVar22 = 0xf;
                  if (local_428 != &local_418) {
                    uVar22 = local_418._M_allocated_capacity;
                  }
                  if ((ulong)uVar22 < local_360._M_string_length + local_420) {
                    uVar22 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_360._M_dataplus._M_p != &local_360.field_2) {
                      uVar22 = local_360.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_360._M_string_length + local_420) goto LAB_0013b24b;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_360,0,(char *)0x0,(ulong)local_428);
                  }
                  else {
LAB_0013b24b:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_428,(ulong)local_360._M_dataplus._M_p);
                  }
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = (ulong *)(plVar7 + 2);
                  if ((ulong *)*plVar7 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = plVar7[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*plVar7;
                  }
                  local_400 = plVar7[1];
                  *plVar7 = (long)puVar14;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if (local_3e0 != &local_3d0) {
                    operator_delete(local_3e0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_380._M_dataplus._M_p != &local_380.field_2) {
                    operator_delete(local_380._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                    operator_delete(local_3c0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                    operator_delete(local_3a0._M_dataplus._M_p);
                  }
                  if (sVar19 == ppVar13->first && ppVar13->second == sVar25) goto LAB_0013bab8;
                  getAttributeName_abi_cxx11_(&local_3c0,local_3e8,ppVar13->first);
                  puVar8 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x2a2571);
                  local_3e0 = &local_3d0;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3d0 = *puVar14;
                    lStack_3c8 = puVar8[3];
                  }
                  else {
                    local_3d0 = *puVar14;
                    local_3e0 = (ulong *)*puVar8;
                  }
                  local_3d8 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
                  local_428 = &local_418;
                  psVar15 = puVar8 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_418._M_allocated_capacity = *psVar15;
                    local_418._8_8_ = puVar8[3];
                  }
                  else {
                    local_418._M_allocated_capacity = *psVar15;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar8;
                  }
                  local_420 = puVar8[1];
                  *puVar8 = psVar15;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_3a0,local_3e8,ppVar13->first);
                  uVar22 = 0xf;
                  if (local_428 != &local_418) {
                    uVar22 = local_418._M_allocated_capacity;
                  }
                  if ((ulong)uVar22 < local_3a0._M_string_length + local_420) {
                    uVar22 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      uVar22 = local_3a0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_3a0._M_string_length + local_420) goto LAB_0013b5db;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_428);
                  }
                  else {
LAB_0013b5db:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_428,(ulong)local_3a0._M_dataplus._M_p);
                  }
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                    operator_delete(local_3a0._M_dataplus._M_p);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if (local_3e0 != &local_3d0) {
                    operator_delete(local_3e0);
                  }
                  _Var21._M_p = local_3c0._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
LAB_0013bab3:
                    operator_delete(_Var21._M_p);
                  }
                }
LAB_0013bab8:
                uVar11 = local_298->aggNum;
                cVar20 = '\x01';
                if (9 < uVar11) {
                  uVar17 = uVar11;
                  cVar6 = '\x04';
                  do {
                    cVar20 = cVar6;
                    if (uVar17 < 100) {
                      cVar20 = cVar20 + -2;
                      goto LAB_0013bb1d;
                    }
                    if (uVar17 < 1000) {
                      cVar20 = cVar20 + -1;
                      goto LAB_0013bb1d;
                    }
                    if (uVar17 < 10000) goto LAB_0013bb1d;
                    bVar2 = 99999 < uVar17;
                    uVar17 = uVar17 / 10000;
                    cVar6 = cVar20 + '\x04';
                  } while (bVar2);
                  cVar20 = cVar20 + '\x01';
                }
LAB_0013bb1d:
                local_428 = &local_418;
                std::__cxx11::string::_M_construct((ulong)&local_428,cVar20);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (local_428->_M_local_buf,(uint)local_420,uVar11);
                plVar7 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_428,0,(char *)0x0,0x2b1927);
                local_448 = &local_438;
                puVar14 = (ulong *)(plVar7 + 2);
                if ((ulong *)*plVar7 == puVar14) {
                  local_438 = *puVar14;
                  lStack_430 = plVar7[3];
                }
                else {
                  local_438 = *puVar14;
                  local_448 = (ulong *)*plVar7;
                }
                local_440 = plVar7[1];
                *plVar7 = (long)puVar14;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
                local_408 = &local_3f8;
                puVar14 = (ulong *)(plVar7 + 2);
                if ((ulong *)*plVar7 == puVar14) {
                  local_3f8 = *puVar14;
                  lStack_3f0 = plVar7[3];
                }
                else {
                  local_3f8 = *puVar14;
                  local_408 = (ulong *)*plVar7;
                }
                local_400 = plVar7[1];
                *plVar7 = (long)puVar14;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
                if (local_408 != &local_3f8) {
                  operator_delete(local_408);
                }
                if (local_448 != &local_438) {
                  operator_delete(local_448);
                }
                if (local_428 != &local_418) {
                  operator_delete(local_428);
                }
                if ((sVar25 != ppVar13->second) || (uVar11 = sVar25, sVar19 != ppVar13->first)) {
                  uVar11 = local_298->aggNum;
                  cVar20 = '\x01';
                  if (9 < uVar11) {
                    uVar17 = uVar11;
                    cVar6 = '\x04';
                    do {
                      cVar20 = cVar6;
                      if (uVar17 < 100) {
                        cVar20 = cVar20 + -2;
                        goto LAB_0013bcd0;
                      }
                      if (uVar17 < 1000) {
                        cVar20 = cVar20 + -1;
                        goto LAB_0013bcd0;
                      }
                      if (uVar17 < 10000) goto LAB_0013bcd0;
                      bVar2 = 99999 < uVar17;
                      uVar17 = uVar17 / 10000;
                      cVar6 = cVar20 + '\x04';
                    } while (bVar2);
                    cVar20 = cVar20 + '\x01';
                  }
LAB_0013bcd0:
                  local_428 = &local_418;
                  std::__cxx11::string::_M_construct((ulong)&local_428,cVar20);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_428->_M_local_buf,(uint)local_420,uVar11);
                  puVar8 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x2b1927);
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  uVar11 = ppVar13->second;
                }
                if (((local_3e8->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar11 >> 6] >>
                     (uVar11 & 0x3f) & 1) == 0) {
                  uVar11 = (local_3e8->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar11];
                  cVar20 = '\x01';
                  if (9 < uVar11) {
                    uVar17 = uVar11;
                    cVar6 = '\x04';
                    do {
                      cVar20 = cVar6;
                      if (uVar17 < 100) {
                        cVar20 = cVar20 + -2;
                        goto LAB_0013c3df;
                      }
                      if (uVar17 < 1000) {
                        cVar20 = cVar20 + -1;
                        goto LAB_0013c3df;
                      }
                      if (uVar17 < 10000) goto LAB_0013c3df;
                      bVar2 = 99999 < uVar17;
                      uVar17 = uVar17 / 10000;
                      cVar6 = cVar20 + '\x04';
                    } while (bVar2);
                    cVar20 = cVar20 + '\x01';
                  }
LAB_0013c3df:
                  local_428 = &local_418;
                  std::__cxx11::string::_M_construct((ulong)&local_428,cVar20);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_428->_M_local_buf,(uint)local_420,uVar11);
                  puVar8 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x2a26af);
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if ((sVar25 == ppVar13->second) && (sVar19 == ppVar13->first)) goto LAB_0013c6c8;
                  uVar11 = (local_3e8->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[ppVar13->second];
                  cVar20 = '\x01';
                  if (9 < uVar11) {
                    uVar17 = uVar11;
                    cVar6 = '\x04';
                    do {
                      cVar20 = cVar6;
                      if (uVar17 < 100) {
                        cVar20 = cVar20 + -2;
                        goto LAB_0013c59c;
                      }
                      if (uVar17 < 1000) {
                        cVar20 = cVar20 + -1;
                        goto LAB_0013c59c;
                      }
                      if (uVar17 < 10000) goto LAB_0013c59c;
                      bVar2 = 99999 < uVar17;
                      uVar17 = uVar17 / 10000;
                      cVar6 = cVar20 + '\x04';
                    } while (bVar2);
                    cVar20 = cVar20 + '\x01';
                  }
LAB_0013c59c:
                  local_428 = &local_418;
                  std::__cxx11::string::_M_construct((ulong)&local_428,cVar20);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_428->_M_local_buf,(uint)local_420,uVar11);
                  puVar8 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x2a26af);
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                    local_408 = &local_3f8;
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  paVar12 = &local_418;
                  _Var21._M_p = (pointer)local_428;
LAB_0013c6be:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var21._M_p != paVar12) {
                    operator_delete(_Var21._M_p);
                  }
                }
                else {
                  getAttributeName_abi_cxx11_(&local_3c0,local_3e8,uVar11);
                  puVar8 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x2a2571);
                  local_3e0 = &local_3d0;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3d0 = *puVar14;
                    lStack_3c8 = puVar8[3];
                  }
                  else {
                    local_3d0 = *puVar14;
                    local_3e0 = (ulong *)*puVar8;
                  }
                  local_3d8 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
                  local_428 = &local_418;
                  psVar15 = puVar8 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_418._M_allocated_capacity = *psVar15;
                    local_418._8_8_ = puVar8[3];
                  }
                  else {
                    local_418._M_allocated_capacity = *psVar15;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar8;
                  }
                  local_420 = puVar8[1];
                  *puVar8 = psVar15;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_3a0,local_3e8,ppVar13->second);
                  uVar22 = 0xf;
                  if (local_428 != &local_418) {
                    uVar22 = local_418._M_allocated_capacity;
                  }
                  if ((ulong)uVar22 < local_3a0._M_string_length + local_420) {
                    uVar22 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      uVar22 = local_3a0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_3a0._M_string_length + local_420) goto LAB_0013bfda;
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_428);
                  }
                  else {
LAB_0013bfda:
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_428,(ulong)local_3a0._M_dataplus._M_p);
                  }
                  local_448 = &local_438;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_438 = *puVar14;
                    lStack_430 = puVar8[3];
                  }
                  else {
                    local_438 = *puVar14;
                    local_448 = (ulong *)*puVar8;
                  }
                  local_440 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                  local_408 = &local_3f8;
                  puVar14 = puVar8 + 2;
                  if ((ulong *)*puVar8 == puVar14) {
                    local_3f8 = *puVar14;
                    lStack_3f0 = puVar8[3];
                  }
                  else {
                    local_3f8 = *puVar14;
                    local_408 = (ulong *)*puVar8;
                  }
                  local_400 = puVar8[1];
                  *puVar8 = puVar14;
                  puVar8[1] = 0;
                  *(undefined1 *)(puVar8 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
                  if (local_408 != &local_3f8) {
                    operator_delete(local_408);
                  }
                  if (local_448 != &local_438) {
                    operator_delete(local_448);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                    operator_delete(local_3a0._M_dataplus._M_p);
                  }
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if (local_3e0 != &local_3d0) {
                    operator_delete(local_3e0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                    operator_delete(local_3c0._M_dataplus._M_p);
                  }
                  if ((sVar25 != ppVar13->second) || (sVar19 != ppVar13->first)) {
                    getAttributeName_abi_cxx11_(&local_3c0,local_3e8,ppVar13->second);
                    puVar8 = (undefined8 *)
                             std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x2a2571)
                    ;
                    local_3e0 = &local_3d0;
                    puVar14 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar14) {
                      local_3d0 = *puVar14;
                      lStack_3c8 = puVar8[3];
                    }
                    else {
                      local_3d0 = *puVar14;
                      local_3e0 = (ulong *)*puVar8;
                    }
                    local_3d8 = puVar8[1];
                    *puVar8 = puVar14;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
                    local_428 = &local_418;
                    psVar15 = puVar8 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar15) {
                      local_418._M_allocated_capacity = *psVar15;
                      local_418._8_8_ = puVar8[3];
                    }
                    else {
                      local_418._M_allocated_capacity = *psVar15;
                      local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)*puVar8;
                    }
                    local_420 = puVar8[1];
                    *puVar8 = psVar15;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    getAttributeName_abi_cxx11_(&local_3a0,local_3e8,ppVar13->second);
                    uVar22 = 0xf;
                    if (local_428 != &local_418) {
                      uVar22 = local_418._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_3a0._M_string_length + local_420) {
                      uVar22 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                        uVar22 = local_3a0.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar22 < local_3a0._M_string_length + local_420) goto LAB_0013c291;
                      puVar8 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_428);
                    }
                    else {
LAB_0013c291:
                      puVar8 = (undefined8 *)
                               std::__cxx11::string::_M_append
                                         ((char *)&local_428,(ulong)local_3a0._M_dataplus._M_p);
                    }
                    local_448 = &local_438;
                    puVar14 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar14) {
                      local_438 = *puVar14;
                      lStack_430 = puVar8[3];
                    }
                    else {
                      local_438 = *puVar14;
                      local_448 = (ulong *)*puVar8;
                    }
                    local_440 = puVar8[1];
                    *puVar8 = puVar14;
                    puVar8[1] = 0;
                    *(undefined1 *)puVar14 = 0;
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
                    puVar14 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar14) {
                      local_3f8 = *puVar14;
                      lStack_3f0 = puVar8[3];
                      local_408 = &local_3f8;
                    }
                    else {
                      local_3f8 = *puVar14;
                      local_408 = (ulong *)*puVar8;
                    }
                    local_400 = puVar8[1];
                    *puVar8 = puVar14;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
                    if (local_408 != &local_3f8) {
                      operator_delete(local_408);
                    }
                    if (local_448 != &local_438) {
                      operator_delete(local_448);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      operator_delete(local_3a0._M_dataplus._M_p);
                    }
                    if (local_428 != &local_418) {
                      operator_delete(local_428);
                    }
                    if (local_3e0 != &local_3d0) {
                      operator_delete(local_3e0);
                    }
                    paVar12 = &local_3c0.field_2;
                    _Var21._M_p = local_3c0._M_dataplus._M_p;
                    goto LAB_0013c6be;
                  }
                }
LAB_0013c6c8:
                sVar25 = ppVar13->first;
                sVar19 = ppVar13->second;
                ppVar23 = (local_298->incVars).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar13 = *(pointer *)
                           ((long)&(local_298->incVars).
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl + 8);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 < (ulong)((long)ppVar13 - (long)ppVar23 >> 4));
          }
          uVar24 = local_c0;
          pAVar10 = local_298 + 1;
        } while (pAVar10 != local_b8);
        if ((bVar3 || bVar4) &&
            (&((local_e0.
                super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
              super__Vector_impl_data._M_start)[local_288] !=
            (&((local_e0.
                super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
              super__Vector_impl_data._M_finish)[local_288]) {
          local_448 = &local_438;
          std::__cxx11::string::_M_construct((ulong)&local_448,'\x06');
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
          local_448 = &local_438;
          std::__cxx11::string::_M_construct((ulong)&local_448,'\x06');
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
          puVar14 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar14) {
            local_3f8 = *puVar14;
            lStack_3f0 = puVar8[3];
            local_408 = &local_3f8;
          }
          else {
            local_3f8 = *puVar14;
            local_408 = (ulong *)*puVar8;
          }
          local_400 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_408);
          if (local_408 != &local_3f8) {
            operator_delete(local_408);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448);
          }
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_290);
  }
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_3c0.field_2._M_allocated_capacity = *puVar14;
    local_3c0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_3c0.field_2._M_allocated_capacity = *puVar14;
    local_3c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_3c0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\t');
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    uVar22 = local_3c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      uVar22 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_380._M_string_length + local_3c0._M_string_length) goto LAB_0013c9d5;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_380,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
  }
  else {
LAB_0013c9d5:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_380._M_dataplus._M_p);
  }
  local_3e0 = &local_3d0;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_3d0 = *puVar14;
    lStack_3c8 = puVar8[3];
  }
  else {
    local_3d0 = *puVar14;
    local_3e0 = (ulong *)*puVar8;
  }
  local_3d8 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_428 = &local_418;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_418._8_8_ = plVar7[3];
  }
  else {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7;
  }
  local_420 = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x03');
  uVar22 = 0xf;
  if (local_428 != &local_418) {
    uVar22 = local_418._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_360._M_string_length + local_420) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      uVar22 = local_360.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_360._M_string_length + local_420) goto LAB_0013cb15;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_428);
  }
  else {
LAB_0013cb15:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_360._M_dataplus._M_p);
  }
  local_448 = &local_438;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_438 = *puVar14;
    lStack_430 = puVar8[3];
  }
  else {
    local_438 = *puVar14;
    local_448 = (ulong *)*puVar8;
  }
  local_440 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_3f8 = *puVar14;
    lStack_3f0 = plVar7[3];
    local_408 = &local_3f8;
  }
  else {
    local_3f8 = *puVar14;
    local_408 = (ulong *)*plVar7;
  }
  local_400 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append(local_2c0,(ulong)local_408);
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  uVar24 = (local_3e8->_parameterIndex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[local_3e8->labelID];
  cVar20 = '\x01';
  if (9 < uVar24) {
    uVar11 = uVar24;
    cVar6 = '\x04';
    do {
      cVar20 = cVar6;
      if (uVar11 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_0013cd0b;
      }
      if (uVar11 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_0013cd0b;
      }
      if (uVar11 < 10000) goto LAB_0013cd0b;
      bVar3 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar20 + '\x04';
    } while (bVar3);
    cVar20 = cVar20 + '\x01';
  }
LAB_0013cd0b:
  local_408 = &local_3f8;
  std::__cxx11::string::_M_construct((ulong)&local_408,cVar20);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_408,(uint)local_400,uVar24);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_270 = *puVar14;
    lStack_268 = plVar7[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *puVar14;
    local_280 = (ulong *)*plVar7;
  }
  local_278 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_160 = local_150;
  std::__cxx11::string::_M_construct((ulong)&local_160,'\x06');
  uVar24 = 0xf;
  if (local_280 != &local_270) {
    uVar24 = local_270;
  }
  if (uVar24 < (ulong)(local_158 + local_278)) {
    uVar24 = 0xf;
    if (local_160 != local_150) {
      uVar24 = local_150[0];
    }
    if (uVar24 < (ulong)(local_158 + local_278)) goto LAB_0013ce33;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_0013ce33:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_160);
  }
  local_240 = &local_230;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_230 = *puVar1;
    uStack_228 = puVar8[3];
  }
  else {
    local_230 = *puVar1;
    local_240 = (undefined8 *)*puVar8;
  }
  local_238 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_240);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_250 = *puVar14;
    lStack_248 = plVar7[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar14;
    local_260 = (ulong *)*plVar7;
  }
  local_258 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_180 = local_170;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  uVar24 = 0xf;
  if (local_260 != &local_250) {
    uVar24 = local_250;
  }
  if (uVar24 < (ulong)(local_178 + local_258)) {
    uVar24 = 0xf;
    if (local_180 != local_170) {
      uVar24 = local_170[0];
    }
    if (uVar24 < (ulong)(local_178 + local_258)) goto LAB_0013cf81;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_0013cf81:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_180);
  }
  local_220 = &local_210;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_210 = *puVar1;
    uStack_208 = puVar8[3];
  }
  else {
    local_210 = *puVar1;
    local_220 = (undefined8 *)*puVar8;
  }
  local_218 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_130 = *puVar14;
    lStack_128 = plVar7[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *puVar14;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x06');
  uVar24 = 0xf;
  if (local_140 != &local_130) {
    uVar24 = local_130;
  }
  if (uVar24 < (ulong)(local_198 + local_138)) {
    uVar24 = 0xf;
    if (local_1a0 != local_190) {
      uVar24 = local_190[0];
    }
    if (uVar24 < (ulong)(local_198 + local_138)) goto LAB_0013d0d0;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_140);
  }
  else {
LAB_0013d0d0:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1a0);
  }
  local_200 = &local_1f0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar8[3];
  }
  else {
    local_1f0 = *puVar1;
    local_200 = (undefined8 *)*puVar8;
  }
  local_1f8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_200);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_110 = *puVar14;
    lStack_108 = plVar7[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar14;
    local_120 = (ulong *)*plVar7;
  }
  local_118 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\t');
  uVar24 = 0xf;
  if (local_120 != &local_110) {
    uVar24 = local_110;
  }
  if (uVar24 < (ulong)(local_1b8 + local_118)) {
    uVar24 = 0xf;
    if (local_1c0 != local_1b0) {
      uVar24 = local_1b0[0];
    }
    if (uVar24 < (ulong)(local_1b8 + local_118)) goto LAB_0013d21e;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_0013d21e:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1c0);
  }
  local_1e0 = &local_1d0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_1d0 = *puVar1;
    uStack_1c8 = puVar8[3];
  }
  else {
    local_1d0 = *puVar1;
    local_1e0 = (undefined8 *)*puVar8;
  }
  local_1d8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_f0 = *puVar14;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar14;
    local_100 = (ulong *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  uVar24 = 0xf;
  if (local_100 != &local_f0) {
    uVar24 = local_f0;
  }
  if (uVar24 < (ulong)(local_68 + local_f8)) {
    uVar24 = 0xf;
    if (local_70 != local_60) {
      uVar24 = local_60[0];
    }
    if (uVar24 < (ulong)(local_68 + local_f8)) goto LAB_0013d36e;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0013d36e:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_70);
  }
  local_2e0 = &local_2d0;
  puVar14 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar14) {
    local_2d0 = *puVar14;
    uStack_2c8 = puVar8[3];
  }
  else {
    local_2d0 = *puVar14;
    local_2e0 = (ulong *)*puVar8;
  }
  local_2d8 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_320 = &local_310;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_310 = *puVar14;
    lStack_308 = plVar7[3];
  }
  else {
    local_310 = *puVar14;
    local_320 = (ulong *)*plVar7;
  }
  local_318 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_408);
  local_340 = &local_330;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_330 = *puVar14;
    lStack_328 = plVar7[3];
  }
  else {
    local_330 = *puVar14;
    local_340 = (ulong *)*plVar7;
  }
  local_338 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_340);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_360.field_2._M_allocated_capacity = *psVar15;
    local_360.field_2._8_8_ = plVar7[3];
  }
  else {
    local_360.field_2._M_allocated_capacity = *psVar15;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_408);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_380.field_2._M_allocated_capacity = *psVar15;
    local_380.field_2._8_8_ = plVar7[3];
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar15;
    local_380._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_380._M_string_length = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_3a0.field_2._M_allocated_capacity = *puVar14;
    local_3a0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_3a0.field_2._M_allocated_capacity = *puVar14;
    local_3a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_3a0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    uVar22 = local_3a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_88 + local_3a0._M_string_length) {
    uVar24 = 0xf;
    if (local_90 != local_80) {
      uVar24 = local_80[0];
    }
    if (uVar24 < local_88 + local_3a0._M_string_length) goto LAB_0013d65d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
  }
  else {
LAB_0013d65d:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_90);
  }
  psVar15 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_3c0.field_2._M_allocated_capacity = *psVar15;
    local_3c0.field_2._8_8_ = puVar8[3];
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  }
  else {
    local_3c0.field_2._M_allocated_capacity = *psVar15;
    local_3c0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_3c0._M_string_length = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_3e0 = &local_3d0;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_3d0 = *puVar14;
    lStack_3c8 = plVar7[3];
  }
  else {
    local_3d0 = *puVar14;
    local_3e0 = (ulong *)*plVar7;
  }
  local_3d8 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x03');
  uVar24 = 0xf;
  if (local_3e0 != &local_3d0) {
    uVar24 = local_3d0;
  }
  if (uVar24 < (ulong)(local_a8 + local_3d8)) {
    uVar24 = 0xf;
    if (local_b0 != local_a0) {
      uVar24 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_3d8) <= uVar24) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_3e0);
      goto LAB_0013d7c6;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_b0);
LAB_0013d7c6:
  local_428 = &local_418;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar12) {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_418._8_8_ = puVar8[3];
  }
  else {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
  }
  local_420 = puVar8[1];
  *puVar8 = paVar12;
  puVar8[1] = 0;
  paVar12->_M_local_buf[0] = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_428);
  local_448 = &local_438;
  puVar14 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar14) {
    local_438 = *puVar14;
    lStack_430 = plVar7[3];
  }
  else {
    local_438 = *puVar14;
    local_448 = (ulong *)*plVar7;
  }
  local_440 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_448);
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  __return_storage_ptr___00 = local_c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::operator+(__return_storage_ptr___00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 &local_300);
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._0_8_ != &aStack_2b0) {
    operator_delete((void *)local_2c0._0_8_);
  }
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::~vector(&local_e0);
  return __return_storage_ptr___00;
}

Assistant:

std::string LinearRegression::generateGradients()
{
    size_t numberOfViews = _compiler->numberOfViews();

    std::vector<std::vector<ActualGradient>> actualGradients(numberOfViews);
        
    for(PartialGradient& pGrad : partialGradients)
    {
        // get view and aggregate corresponding to the query
        std::pair<size_t,size_t>& viewAggPair =
            pGrad.query->_aggregates[0]->_incoming[0];
        
        // Assign to view, the aggregate and the corresponding param, grad pair
        ActualGradient ag;
        ag.aggNum = viewAggPair.second;
        ag.incVars = pGrad.inputVariables;

        actualGradients[viewAggPair.first].push_back(ag);
    }

    // TODO: *Observations:* the view with all continuous aggregates only has one tuple
    // Ideally, we would have the corresponding params in an array so this
    // computation can be vectorized ! Ideally also the gradients should be a vector !
    
    std::string gradString =  offset(1)+"void computeGradient()\n"+offset(1)+"{\n"+
        offset(2)+"memset(grad, 0, numberOfParameters * "+
        std::to_string(sizeof(double))+");\n";

    std::string errorString =  offset(1)+"void computeError()\n"+offset(1)+"{\n"+
        offset(2)+"error = 0.0;\n";
    
    for (size_t viewID = 0; viewID < numberOfViews; ++viewID)
    {
        // TODO: check if this view has at least one free variable
        // If it does not then avoid the for loop, get the tuple reference and
        // adjust the offset
        bool viewHasFreeVars = _compiler->getView(viewID)->_fVars.any();
        size_t off = 3;
        
        if (!actualGradients[viewID].empty())
        {
            if (viewHasFreeVars)
            {
                gradString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
                errorString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
            }
            else
            {
                gradString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                errorString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                off = 2;
            }
        }
        
        for (ActualGradient& ag : actualGradients[viewID])
        {
            size_t prevGradID = 1000;
            size_t prevParamID = 1000;

            // TODO: TODO: We go at great length to avoid adding errors twice
            // here, this could surely be simplified by adding each combination
            // to actualGradients only once!
            
            for (size_t i = 0; i < ag.incVars.size(); i++)
            {
                size_t& gradID = ag.incVars[i].first;
                size_t& paramID = ag.incVars[i].second;

                if (gradID == labelID)
                    continue;

                if (prevGradID != paramID || prevParamID != gradID) 
                    errorString += offset(off)+ "error += ";

                if (gradID == paramID &&
                    (prevGradID != paramID || prevParamID != gradID))
                    errorString += "0.5 * ";
                
                if (_categoricalFeatures[gradID])
                {   
                    gradString += offset(off)+"grad[index_"+getAttributeName(gradID)+
                        "[tuple."+getAttributeName(gradID)+"]] += ";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(gradID)+
                            "[tuple."+getAttributeName(gradID)+"]] * ";
                }
                else
                {
                    gradString += offset(off)+"grad["+
                        std::to_string(_parameterIndex[gradID])+"] += ";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[gradID])+"] * ";
                }
                
                gradString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";

                if (prevGradID != paramID || prevParamID != gradID)
                    errorString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";
            
                if (_categoricalFeatures[paramID])
                {
                    gradString += "params[index_"+getAttributeName(paramID)+
                        "[tuple."+getAttributeName(paramID)+"]];\n";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(paramID)+
                            "[tuple."+getAttributeName(paramID)+"]];\n";
                }
                else
                {
                    // gradString += "param_"+getAttributeName(paramID)+";\n";
                    gradString += "params["+
                        std::to_string(_parameterIndex[paramID])+"];\n";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[paramID])+"];\n";
                }

                prevGradID = gradID;
                prevParamID = paramID;
            }
        }
        if (!actualGradients[viewID].empty() && viewHasFreeVars)
        {    
            gradString += offset(2)+"}\n";
            errorString += offset(2)+"}\n";
        }
        
    }
    gradString += offset(2)+"for (size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(3)+"grad[j] /= tuple.aggregates[0];\n"+
        offset(1)+"}\n\n";

    std::string labelStr = std::to_string(_parameterIndex[labelID]);
    
    errorString +=  offset(2)+"error /= tuple.aggregates[0];\n\n"+
        offset(2)+"double paramNorm = 0.0;\n"+
        offset(2)+"/* Adding the regulariser to the error */\n"+
        offset(2)+"for (size_t j = 1; j < numberOfParameters; ++j)\n"+
        offset(3)+"paramNorm += params[j] * params[j];\n"+
        offset(2)+"paramNorm -= params["+labelStr+"] * params["+labelStr+"];\n\n"+
        offset(2)+"error += lambda[1] * paramNorm;\n"+
        offset(1)+"}\n";

    return gradString + errorString;
}